

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool VerifyWitnessProgram
               (CScriptWitness *witness,int witversion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint flags,
               BaseSignatureChecker *checker,ScriptError *serror,bool is_p2sh)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control;
  pointer pvVar1;
  pointer pvVar2;
  VectorFormatter<DefaultFormatter> *pVVar3;
  pointer pbVar4;
  char *pcVar5;
  pointer puVar6;
  pointer puVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  CSHA256 *pCVar13;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  uint uVar14;
  long lVar15;
  undefined8 uVar16;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  span<const_std::byte,_18446744073709551615UL> b;
  Span<const_unsigned_char> script;
  uint256 hash_exec_script;
  CScript exec_script;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_178;
  direct_or_indirect local_168;
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  VectorFormatter<DefaultFormatter> local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [42];
  undefined1 local_ae [16];
  undefined1 local_9e [16];
  bool local_8e;
  long local_88;
  bool local_60;
  direct_or_indirect local_58;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0;
  local_58._20_8_ = 0;
  uStack_3c = 0;
  local_58.indirect_contents.indirect = (char *)0x0;
  local_58.indirect_contents.capacity = 0;
  local_58._12_4_ = 0;
  pvVar1 = (witness->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (witness->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)pvVar2 - (long)pvVar1;
  local_178.m_size = (lVar12 >> 3) * -0x5555555555555555;
  local_d8[0x28] = false;
  local_60 = false;
  local_d8[0] = false;
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\0';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  local_d8[8] = '\0';
  local_d8[9] = '\0';
  local_d8[10] = '\0';
  local_d8[0xb] = '\0';
  local_d8[0xc] = '\0';
  local_d8[0xd] = '\0';
  local_d8[0xe] = '\0';
  local_d8[0xf] = '\0';
  local_d8[0x10] = '\0';
  local_d8[0x11] = '\0';
  local_d8[0x12] = '\0';
  local_d8[0x13] = '\0';
  local_d8[0x14] = '\0';
  local_d8[0x15] = '\0';
  local_d8[0x16] = '\0';
  local_d8[0x17] = '\0';
  local_d8[0x18] = '\0';
  local_d8[0x19] = '\0';
  local_d8[0x1a] = '\0';
  local_d8[0x1b] = '\0';
  local_d8[0x1c] = '\0';
  local_d8[0x1d] = '\0';
  local_d8[0x1e] = '\0';
  local_d8[0x1f] = '\0';
  local_d8[0x20] = '\0';
  local_d8[0x21] = false;
  local_ae = (undefined1  [16])0x0;
  local_9e = (undefined1  [16])0x0;
  local_8e = false;
  local_178.m_data = pvVar1;
  if (witversion == 1) {
    if ((long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x20 || is_p2sh) goto LAB_00421496;
    if ((flags >> 0x11 & 1) == 0) {
LAB_004214e2:
      bVar9 = true;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_OK;
      }
      goto LAB_004218c0;
    }
    if (pvVar2 == pvVar1) {
LAB_004216e3:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY;
      }
    }
    else {
      if (((local_178.m_size < 2) ||
          (pcVar5 = *(char **)((long)pvVar1 + lVar12 + -0x18),
          pcVar5 == *(char **)((long)pvVar1 + lVar12 + -0x10))) || (*pcVar5 != 'P')) {
        local_d8[0x29] = false;
      }
      else {
        uVar18 = local_178.m_size - 1;
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        local_148 = (undefined1  [16])0x0;
        local_168._16_4_ = 0;
        local_168._20_4_ = 0;
        local_168._24_4_ = 0;
        uStack_14c = 0;
        local_168.direct[0] = '\0';
        local_168._1_7_ = 0;
        local_168.indirect_contents.capacity = 0;
        local_168._12_4_ = 0;
        local_108 = 0;
        local_178.m_size = uVar18;
        CSHA256::CSHA256((CSHA256 *)&local_168.indirect_contents);
        pCVar13 = &HashWriter::operator<<
                             ((HashWriter *)&local_168.indirect_contents,pvVar1 + uVar18)->ctx;
        local_e8 = (undefined1  [16])0x0;
        local_f8[0] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[1] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[2] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[3] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[4] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[5] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[6] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[7] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[8] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[9] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[10] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xb] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xc] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xd] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xe] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xf] = (VectorFormatter<DefaultFormatter>)0x0;
        CSHA256::Finalize(pCVar13,(uchar *)local_f8);
        local_9e = local_e8;
        local_ae[0] = local_f8[0];
        local_ae[1] = local_f8[1];
        local_ae[2] = local_f8[2];
        local_ae[3] = local_f8[3];
        local_ae[4] = local_f8[4];
        local_ae[5] = local_f8[5];
        local_ae[6] = local_f8[6];
        local_ae[7] = local_f8[7];
        local_ae[8] = local_f8[8];
        local_ae[9] = local_f8[9];
        local_ae[10] = local_f8[10];
        local_ae[0xb] = local_f8[0xb];
        local_ae[0xc] = local_f8[0xc];
        local_ae[0xd] = local_f8[0xd];
        local_ae[0xe] = local_f8[0xe];
        local_ae[0xf] = local_f8[0xf];
        local_d8[0x29] = true;
      }
      local_d8[0x28] = true;
      if (local_178.m_size == 1) {
        puVar6 = (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        puVar7 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar11 = (*checker->_vptr_BaseSignatureChecker[1])
                           (checker,puVar6,
                            (long)(pvVar1->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6,puVar7,
                            (long)(program->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7,2,
                            local_d8,serror);
        if ((char)iVar11 != '\0') goto LAB_004214e2;
      }
      else {
        uVar18 = local_178.m_size - 2;
        lVar12 = (long)pvVar1[local_178.m_size - 1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)pvVar1[local_178.m_size - 1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((lVar12 - 0x1022U < 0xffffffffffffefff) || (((int)lVar12 - 1U & 0x1f) != 0)) {
          local_178.m_size = uVar18;
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE;
          }
        }
        else {
          control = pvVar1 + (local_178.m_size - 1);
          puVar6 = control[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          script.m_size =
               (long)control[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
          script.m_data = puVar6;
          local_178.m_size = uVar18;
          ComputeTapleafHash((uint256 *)&local_168.indirect_contents,
                             *(control->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start & 0xfe,script);
          local_d8._2_7_ = local_168._1_7_;
          local_d8[1] = local_168.direct[0];
          local_d8._21_4_ = local_168._20_4_;
          local_d8._17_4_ = local_168._16_4_;
          local_d8._25_7_ = (undefined7)CONCAT44(uStack_14c,local_168._24_4_);
          local_d8[0x20] = (uchar)(uStack_14c >> 0x18);
          local_d8._9_7_ =
               (undefined7)CONCAT44(local_168._12_4_,local_168.indirect_contents.capacity);
          local_d8[0x10] = (uchar)((uint)local_168._12_4_ >> 0x18);
          bVar9 = VerifyTaprootCommitment(control,program,(uint256 *)(local_d8 + 1));
          if (!bVar9) goto LAB_004218b2;
          local_d8[0] = true;
          if ((*(control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start & 0xfe) == 0xc0) {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       &local_168.indirect_contents,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )control[-1].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )control[-1].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            if (0x1c < uStack_3c) {
              free(local_58.indirect_contents.indirect);
            }
            local_58.indirect_contents.indirect =
                 (char *)CONCAT71(local_168._1_7_,local_168.direct[0]);
            local_58._20_8_ = CONCAT44(local_168._24_4_,local_168._20_4_);
            local_58._16_4_ = local_168._16_4_;
            local_58.indirect_contents.capacity = local_168.indirect_contents.capacity;
            local_58._12_4_ = local_168._12_4_;
            uStack_3c = uStack_14c;
            local_168.direct[0] = '\0';
            local_168._1_7_ = 0;
            VectorFormatter<DefaultFormatter>::
            Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      (local_f8,(SizeComputer *)&local_168.indirect_contents,&witness->stack);
            local_88 = CONCAT71(local_168._1_7_,local_168.direct[0]) + 0x32;
            local_8e = true;
            bVar9 = ExecuteWitnessScript
                              (&local_178,(CScript *)&local_58.indirect_contents,flags,TAPSCRIPT,
                               checker,(ScriptExecutionData *)local_d8,serror);
            goto LAB_004218c0;
          }
          if ((flags >> 0x12 & 1) == 0) goto LAB_004214e2;
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION;
          }
        }
      }
    }
  }
  else {
    if (witversion == 0) {
      lVar15 = (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar15 == 0x14) {
        if (lVar12 == 0x30) {
          local_168.direct[0] = 'v';
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(iterator)&local_58,(uchar *)local_168.direct);
          uVar16 = local_58.indirect_contents.indirect;
          uVar14 = uStack_3c - 0x1d;
          if (uStack_3c < 0x1d) {
            uVar16 = &local_58;
            uVar14 = uStack_3c;
          }
          local_168.direct[0] = -0x57;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar16)->
                                       indirect + (long)(int)uVar14),(uchar *)local_168.direct);
          pbVar4 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          b._M_extent._M_extent_value =
               (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
          b._M_ptr = pbVar4;
          this = &CScript::operator<<((CScript *)&local_58.indirect_contents,b)->super_CScriptBase;
          uVar14 = this->_size;
          uVar8 = uVar14 - 0x1d;
          if (uVar14 < 0x1d) {
            uVar8 = uVar14;
          }
          ppVar17 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                    (this->_union).indirect_contents.indirect;
          if (uVar14 < 0x1d) {
            ppVar17 = this;
          }
          local_168.direct[0] = -0x78;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    (this,(uchar *)((long)&ppVar17->_union + (long)(int)uVar8),
                     (uchar *)local_168.direct);
          uVar14 = this->_size;
          uVar8 = uVar14 - 0x1d;
          if (uVar14 < 0x1d) {
            uVar8 = uVar14;
          }
          ppVar17 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                    (this->_union).indirect_contents.indirect;
          if (uVar14 < 0x1d) {
            ppVar17 = this;
          }
          local_168.direct[0] = -0x54;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    (this,(uchar *)((long)&ppVar17->_union + (long)(int)uVar8),
                     (uchar *)local_168.direct);
          bVar9 = ExecuteWitnessScript
                            (&local_178,(CScript *)&local_58.indirect_contents,flags,WITNESS_V0,
                             checker,(ScriptExecutionData *)local_d8,serror);
          goto LAB_004218c0;
        }
      }
      else {
        if (lVar15 != 0x20) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH;
          }
          goto LAB_004218bd;
        }
        if (pvVar2 == pvVar1) goto LAB_004216e3;
        local_178.m_size = local_178.m_size - 1;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar1[local_178.m_size].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar1[local_178.m_size].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        if (0x1c < uStack_3c) {
          free(local_58.indirect_contents.indirect);
        }
        local_58.indirect_contents.indirect = (char *)CONCAT71(local_168._1_7_,local_168.direct[0]);
        local_58._20_8_ = CONCAT44(local_168._24_4_,local_168._20_4_);
        local_58._16_4_ = local_168._16_4_;
        local_58.indirect_contents.capacity = local_168.indirect_contents.capacity;
        local_58._12_4_ = local_168._12_4_;
        uStack_3c = uStack_14c;
        local_e8 = (undefined1  [16])0x0;
        local_f8[0] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[1] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[2] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[3] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[4] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[5] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[6] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[7] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[8] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[9] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[10] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xb] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xc] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xd] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xe] = (VectorFormatter<DefaultFormatter>)0x0;
        local_f8[0xf] = (VectorFormatter<DefaultFormatter>)0x0;
        CSHA256::CSHA256((CSHA256 *)&local_168.indirect_contents);
        uVar14 = uStack_3c - 0x1d;
        uVar16 = local_58.indirect_contents.indirect;
        if (uStack_3c < 0x1d) {
          uVar14 = uStack_3c;
          uVar16 = &local_58;
        }
        pCVar13 = CSHA256::Write((CSHA256 *)&local_168.indirect_contents,(uchar *)uVar16,
                                 (ulong)uVar14);
        CSHA256::Finalize(pCVar13,(uchar *)local_f8);
        pVVar3 = (VectorFormatter<DefaultFormatter> *)
                 (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        auVar20[0] = -(pVVar3[0x10] == local_e8[0]);
        auVar20[1] = -(pVVar3[0x11] == local_e8[1]);
        auVar20[2] = -(pVVar3[0x12] == local_e8[2]);
        auVar20[3] = -(pVVar3[0x13] == local_e8[3]);
        auVar20[4] = -(pVVar3[0x14] == local_e8[4]);
        auVar20[5] = -(pVVar3[0x15] == local_e8[5]);
        auVar20[6] = -(pVVar3[0x16] == local_e8[6]);
        auVar20[7] = -(pVVar3[0x17] == local_e8[7]);
        auVar20[8] = -(pVVar3[0x18] == local_e8[8]);
        auVar20[9] = -(pVVar3[0x19] == local_e8[9]);
        auVar20[10] = -(pVVar3[0x1a] == local_e8[10]);
        auVar20[0xb] = -(pVVar3[0x1b] == local_e8[0xb]);
        auVar20[0xc] = -(pVVar3[0x1c] == local_e8[0xc]);
        auVar20[0xd] = -(pVVar3[0x1d] == local_e8[0xd]);
        auVar20[0xe] = -(pVVar3[0x1e] == local_e8[0xe]);
        auVar20[0xf] = -(pVVar3[0x1f] == local_e8[0xf]);
        auVar19[0] = -(*pVVar3 == local_f8[0]);
        auVar19[1] = -(pVVar3[1] == local_f8[1]);
        auVar19[2] = -(pVVar3[2] == local_f8[2]);
        auVar19[3] = -(pVVar3[3] == local_f8[3]);
        auVar19[4] = -(pVVar3[4] == local_f8[4]);
        auVar19[5] = -(pVVar3[5] == local_f8[5]);
        auVar19[6] = -(pVVar3[6] == local_f8[6]);
        auVar19[7] = -(pVVar3[7] == local_f8[7]);
        auVar19[8] = -(pVVar3[8] == local_f8[8]);
        auVar19[9] = -(pVVar3[9] == local_f8[9]);
        auVar19[10] = -(pVVar3[10] == local_f8[10]);
        auVar19[0xb] = -(pVVar3[0xb] == local_f8[0xb]);
        auVar19[0xc] = -(pVVar3[0xc] == local_f8[0xc]);
        auVar19[0xd] = -(pVVar3[0xd] == local_f8[0xd]);
        auVar19[0xe] = -(pVVar3[0xe] == local_f8[0xe]);
        auVar19[0xf] = -(pVVar3[0xf] == local_f8[0xf]);
        auVar19 = auVar19 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
          bVar9 = ExecuteWitnessScript
                            (&local_178,(CScript *)&local_58.indirect_contents,flags,WITNESS_V0,
                             checker,(ScriptExecutionData *)local_d8,serror);
          goto LAB_004218c0;
        }
      }
LAB_004218b2:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH;
      }
      goto LAB_004218bd;
    }
LAB_00421496:
    if (is_p2sh) {
      bVar9 = true;
      if ((flags >> 0xc & 1) == 0) goto LAB_004218c0;
    }
    else {
      bVar10 = CScript::IsPayToAnchor(witversion,program);
      bVar9 = true;
      if ((flags >> 0xc & 1) == 0 || bVar10) goto LAB_004218c0;
    }
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM;
    }
  }
LAB_004218bd:
  bVar9 = false;
LAB_004218c0:
  if (0x1c < uStack_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

static bool VerifyWitnessProgram(const CScriptWitness& witness, int witversion, const std::vector<unsigned char>& program, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror, bool is_p2sh)
{
    CScript exec_script; //!< Actually executed script (last stack item in P2WSH; implied P2PKH script in P2WPKH; leaf script in P2TR)
    Span stack{witness.stack};
    ScriptExecutionData execdata;

    if (witversion == 0) {
        if (program.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            // BIP141 P2WSH: 32-byte witness v0 program (which encodes SHA256(script))
            if (stack.size() == 0) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
            }
            const valtype& script_bytes = SpanPopBack(stack);
            exec_script = CScript(script_bytes.begin(), script_bytes.end());
            uint256 hash_exec_script;
            CSHA256().Write(exec_script.data(), exec_script.size()).Finalize(hash_exec_script.begin());
            if (memcmp(hash_exec_script.begin(), program.data(), 32)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else if (program.size() == WITNESS_V0_KEYHASH_SIZE) {
            // BIP141 P2WPKH: 20-byte witness v0 program (which encodes Hash160(pubkey))
            if (stack.size() != 2) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH); // 2 items in witness
            }
            exec_script << OP_DUP << OP_HASH160 << program << OP_EQUALVERIFY << OP_CHECKSIG;
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else {
            return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH);
        }
    } else if (witversion == 1 && program.size() == WITNESS_V1_TAPROOT_SIZE && !is_p2sh) {
        // BIP341 Taproot: 32-byte non-P2SH witness v1 program (which encodes a P2C-tweaked pubkey)
        if (!(flags & SCRIPT_VERIFY_TAPROOT)) return set_success(serror);
        if (stack.size() == 0) return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
        if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
            // Drop annex (this is non-standard; see IsWitnessStandard)
            const valtype& annex = SpanPopBack(stack);
            execdata.m_annex_hash = (HashWriter{} << annex).GetSHA256();
            execdata.m_annex_present = true;
        } else {
            execdata.m_annex_present = false;
        }
        execdata.m_annex_init = true;
        if (stack.size() == 1) {
            // Key path spending (stack size is 1 after removing optional annex)
            if (!checker.CheckSchnorrSignature(stack.front(), program, SigVersion::TAPROOT, execdata, serror)) {
                return false; // serror is set
            }
            return set_success(serror);
        } else {
            // Script path spending (stack size is >1 after removing optional annex)
            const valtype& control = SpanPopBack(stack);
            const valtype& script = SpanPopBack(stack);
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE || ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) {
                return set_error(serror, SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE);
            }
            execdata.m_tapleaf_hash = ComputeTapleafHash(control[0] & TAPROOT_LEAF_MASK, script);
            if (!VerifyTaprootCommitment(control, program, execdata.m_tapleaf_hash)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            execdata.m_tapleaf_hash_init = true;
            if ((control[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                // Tapscript (leaf version 0xc0)
                exec_script = CScript(script.begin(), script.end());
                execdata.m_validation_weight_left = ::GetSerializeSize(witness.stack) + VALIDATION_WEIGHT_OFFSET;
                execdata.m_validation_weight_left_init = true;
                return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::TAPSCRIPT, checker, execdata, serror);
            }
            if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION) {
                return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION);
            }
            return set_success(serror);
        }
    } else if (!is_p2sh && CScript::IsPayToAnchor(witversion, program)) {
        return true;
    } else {
        if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM) {
            return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM);
        }
        // Other version/size/p2sh combinations return true for future softfork compatibility
        return true;
    }
    // There is intentionally no return statement here, to be able to use "control reaches end of non-void function" warnings to detect gaps in the logic above.
}